

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O0

void __thiscall helics::ValueFederate::ValueFederate(ValueFederate *this,char *configString)

{
  string *in_stack_00000158;
  ValueFederate *in_stack_00000160;
  undefined1 in_stack_00000168 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  allocator<char> local_61;
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  __sv_type local_20;
  
  this_00 = &local_40;
  std::__cxx11::string::string(in_stack_ffffffffffffff80);
  local_20 = std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  ValueFederate(in_stack_00000160,(string_view)in_stack_00000168,in_stack_00000158);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_61);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  return;
}

Assistant:

ValueFederate::ValueFederate(const char* configString):
    ValueFederate(std::string{}, std::string{configString})
{
}